

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O1

bool __thiscall
Assimp::Q3BSPFileImporter::expandFile
          (Q3BSPFileImporter *this,ZipArchiveIOSystem *pArchive,string *rFilename,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rExtList,string *rFile,string *rExt)

{
  int iVar1;
  bool bVar2;
  pointer __rhs;
  string textureName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (pArchive == (ZipArchiveIOSystem *)0x0) {
    __assert_fail("__null != pArchive",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                  ,0x2a4,
                  "bool Assimp::Q3BSPFileImporter::expandFile(ZipArchiveIOSystem *, const std::string &, const std::vector<std::string> &, std::string &, std::string &)"
                 );
  }
  if (rFilename->_M_string_length == 0) {
    __assert_fail("!rFilename.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                  ,0x2a5,
                  "bool Assimp::Q3BSPFileImporter::expandFile(ZipArchiveIOSystem *, const std::string &, const std::vector<std::string> &, std::string &, std::string &)"
                 );
  }
  __rhs = (rExtList->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (__rhs == (rExtList->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::_M_assign((string *)rFile);
    std::__cxx11::string::_M_replace((ulong)rExt,0,(char *)rExt->_M_string_length,0x6d5270);
    bVar2 = true;
  }
  else if (__rhs == (rExtList->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    do {
      std::operator+(&local_50,rFilename,__rhs);
      iVar1 = (*(pArchive->super_IOSystem)._vptr_IOSystem[2])(pArchive,local_50._M_dataplus._M_p);
      if ((byte)iVar1 != 0) {
        std::__cxx11::string::_M_assign((string *)rExt);
        bVar2 = true;
        std::__cxx11::string::_M_assign((string *)rFile);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      __rhs = __rhs + 1;
    } while ((byte)((byte)iVar1 |
                   __rhs == (rExtList->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish) != 1);
  }
  return bVar2;
}

Assistant:

bool Q3BSPFileImporter::expandFile(ZipArchiveIOSystem *pArchive, const std::string &rFilename,
                                   const std::vector<std::string> &rExtList, std::string &rFile,
                                   std::string &rExt )
{
    ai_assert( NULL != pArchive );
    ai_assert( !rFilename.empty() );

    if ( rExtList.empty() )
    {
        rFile =  rFilename;
        rExt = "";
        return true;
    }

    bool found = false;
    for ( std::vector<std::string>::const_iterator it = rExtList.begin(); it != rExtList.end(); ++it )
    {
        const std::string textureName = rFilename + *it;
        if ( pArchive->Exists( textureName.c_str() ) )
        {
            rExt = *it;
            rFile = textureName;
            found = true;
            break;
        }
    }

    return found;
}